

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

Type __thiscall
wasm::anon_unknown_20::HeapTypeGeneratorImpl::generateSupertype
          (HeapTypeGeneratorImpl *this,Type type)

{
  __index_type _Var1;
  TypeBuilder *pTVar2;
  pointer pvVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  BasicHeapType BVar7;
  size_type __n;
  Type *pTVar8;
  uintptr_t *puVar9;
  ulong uVar10;
  uintptr_t uVar11;
  iterator iVar12;
  _Optional_payload_base<unsigned_int> _Var13;
  value_type *pvVar14;
  HeapType HVar15;
  uint uVar16;
  Nullability NVar17;
  undefined1 auVar18 [8];
  Iterator IVar19;
  HeapType local_88;
  Type local_80;
  Type type_local;
  Type local_70;
  undefined1 local_68 [8];
  Iterator __begin3;
  undefined1 auStack_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  
  local_80.id = type.id;
  cVar4 = ::wasm::Type::isTuple();
  if (cVar4 != '\0') {
    auStack_48 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __n = ::wasm::Type::size();
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,__n);
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_68 = (undefined1  [8])&local_80;
    IVar19 = Type::end(&local_80);
    type_local.id =
         (uintptr_t)
         IVar19.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    pTVar8 = (Type *)0x0;
    auVar18 = (undefined1  [8])&local_80;
    while ((pTVar8 != (Type *)IVar19.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index || (auVar18 != (undefined1  [8])type_local.id))) {
      puVar9 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_68);
      local_70 = generateSupertype(this,*puVar9);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,&local_70);
      pTVar8 = (Type *)((long)&(__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
      auVar18 = local_68;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar8;
    }
    pTVar2 = this->builder;
    Tuple::Tuple((Tuple *)local_68,(TypeList *)auStack_48);
    uVar11 = ::wasm::TypeBuilder::getTempTupleType((Tuple *)pTVar2);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_68);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48);
    return (Type)uVar11;
  }
  cVar4 = ::wasm::Type::isRef();
  if (cVar4 == '\0') {
    if (local_80.id < 7) {
      return (Type)local_80.id;
    }
    ::wasm::handle_unreachable
              ("unexpected type kind",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/heap-types.cpp"
               ,0x21c);
  }
  uVar10 = ::wasm::Type::getHeapType();
  iVar6 = ::wasm::Type::getNullability();
  if (iVar6 == 1) {
    uVar16 = 1;
  }
  else {
    bVar5 = Random::oneIn(this->rand,2);
    uVar16 = (uint)bVar5;
  }
  auStack_48 = (undefined1  [8])0x0;
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_70.id = uVar10;
  iVar12 = std::
           _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->typeIndices)._M_h,(key_type *)&local_70);
  if (iVar12.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur
      != (__node_type *)0x0) {
    type_local.id._0_4_ = uVar16;
    _Var13._4_4_ = 0;
    _Var13._M_payload._M_value =
         *(uint *)((long)iVar12.
                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                         ._M_cur + 0x10);
    uVar16 = 1;
    while ((char)uVar16 != '\0') {
      local_68 = (undefined1  [8])this->builder;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((ulong)_Var13 & 0xffffffff);
      local_88 = TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)local_68);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,&local_88);
      _Var13 = *(_Optional_payload_base<unsigned_int> *)
                ((this->supertypeIndices).
                 super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)((ulong)_Var13 & 0xffffffff));
      uVar16 = _Var13._4_4_ & 1;
    }
    pvVar3 = (this->typeKinds).
             super__Vector_base<std::variant<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var1 = *(__index_type *)
             ((long)&pvVar3[*(uint *)((long)iVar12.
                                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                            ._M_cur + 0x10)].
                     super__Variant_base<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                     .
                     super__Move_assign_alias<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                     .
                     super__Copy_assign_alias<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             + 4);
    if (_Var1 == '\x01') {
      local_68 = (undefined1  [8])0x1;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                 (HeapType *)local_68);
      pvVar14 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                          (this->rand,
                           (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48);
    }
    else if (_Var1 == '\x02') {
      local_68 = (undefined1  [8])0x5;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                 (HeapType *)local_68);
      local_68 = (undefined1  [8])0x3;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                 (HeapType *)local_68);
      local_68 = (undefined1  [8])0x2;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                 (HeapType *)local_68);
      pvVar14 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                          (this->rand,
                           (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48);
    }
    else {
      if (_Var1 != '\x03') {
        local_70.id = (uintptr_t)
                      *(uint *)&pvVar3[*(uint *)((long)iVar12.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                                  ._M_cur + 0x10)].
                                super__Variant_base<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                                .
                                super__Move_assign_alias<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                                .
                                super__Copy_assign_alias<wasm::HeapType::BasicHeapType,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
        ;
        goto LAB_00185767;
      }
      local_68 = (undefined1  [8])0x6;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                 (HeapType *)local_68);
      local_68 = (undefined1  [8])0x3;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                 (HeapType *)local_68);
      local_68 = (undefined1  [8])0x2;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                 (HeapType *)local_68);
      pvVar14 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                          (this->rand,
                           (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48);
    }
    goto LAB_0018583c;
  }
LAB_00185767:
  if (0xd < local_70.id) {
    __assert_fail("type.isBasic()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x1c4,
                  "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSuperHeapType(HeapType)"
                 );
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
             (value_type *)&local_70);
  BVar7 = HeapType::getBasic((HeapType *)&local_70);
  switch(BVar7) {
  case eq:
    local_68 = (undefined1  [8])0x2;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
               (HeapType *)local_68);
    break;
  case i31:
  case struct_:
  case array:
    local_68 = (undefined1  [8])0x3;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
               (HeapType *)local_68);
    local_68 = (undefined1  [8])0x2;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
               (HeapType *)local_68);
    break;
  case string:
  case stringview_wtf8:
  case stringview_wtf16:
  case stringview_iter:
    local_68 = (undefined1  [8])0x2;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
               (HeapType *)local_68);
    break;
  case none:
    HVar15 = pickSubAny(this);
    NVar17 = (Nullability)HVar15.id;
    goto LAB_0018583f;
  case noext:
    local_68 = (undefined1  [8])0x0;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
               (HeapType *)local_68);
    break;
  case nofunc:
    HVar15 = pickSubFunc(this);
    NVar17 = (Nullability)HVar15.id;
    goto LAB_0018583f;
  }
  if (auStack_48 ==
      (undefined1  [8])
      types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __assert_fail("!candidates.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x1e2,
                  "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSuperHeapType(HeapType)"
                 );
  }
  pvVar14 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                      (this->rand,
                       (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48);
LAB_0018583c:
  NVar17 = (Nullability)pvVar14->id;
LAB_0018583f:
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48);
  uVar11 = ::wasm::TypeBuilder::getTempRefType((HeapType)this->builder,NVar17);
  return (Type)uVar11;
}

Assistant:

Type generateSupertype(Type type) {
    if (type.isTuple()) {
      std::vector<Type> types;
      types.reserve(type.size());
      for (auto t : type) {
        types.push_back(generateSupertype(t));
      }
      return builder.getTempTupleType(types);
    } else if (type.isRef()) {
      auto ref = generateSuperRef({type.getHeapType(), type.getNullability()});
      return builder.getTempRefType(ref.type, ref.nullability);
    } else if (type.isBasic()) {
      // Non-reference basic types do not have supertypes.
      return type;
    } else {
      WASM_UNREACHABLE("unexpected type kind");
    }
  }